

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifold.cpp
# Opt level: O0

void __thiscall
mnf::Manifold::Manifold
          (Manifold *this,Index dimension,Index tangentDimension,Index representationDimension)

{
  long lVar1;
  Index representationDimension_local;
  Index tangentDimension_local;
  Index dimension_local;
  Manifold *this_local;
  
  RefCounter::RefCounter(&this->super_RefCounter);
  ValidManifold::ValidManifold(&this->super_ValidManifold);
  this->_vptr_Manifold = (_func_int **)&PTR__Manifold_00391798;
  std::__cxx11::string::string((string *)&this->name_);
  this->dimension_ = dimension;
  this->tangentDim_ = tangentDimension;
  this->representationDim_ = representationDimension;
  this->lock_ = false;
  if (dimension < 0) {
    __assert_fail("0 <= dimension && \"Negative dimension not accepted\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/src/Manifold.cpp"
                  ,0x21,"mnf::Manifold::Manifold(Index, Index, Index)");
  }
  if (dimension <= tangentDimension) {
    if (representationDimension < tangentDimension) {
      __assert_fail("tangentDimension <= representationDimension",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/src/Manifold.cpp"
                    ,0x23,"mnf::Manifold::Manifold(Index, Index, Index)");
    }
    lVar1 = manifoldCounter_ + 1;
    this->instanceId_ = manifoldCounter_;
    manifoldCounter_ = lVar1;
    return;
  }
  __assert_fail("dimension <= tangentDimension",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/src/Manifold.cpp"
                ,0x22,"mnf::Manifold::Manifold(Index, Index, Index)");
}

Assistant:

Manifold::Manifold(Index dimension, Index tangentDimension,
                   Index representationDimension)
    : dimension_(dimension),
      tangentDim_(tangentDimension),
      representationDim_(representationDimension),
      lock_(false)
{
  mnf_assert(0 <= dimension && "Negative dimension not accepted");
  mnf_assert(dimension <= tangentDimension);
  mnf_assert(tangentDimension <= representationDimension);
  this->instanceId_ = manifoldCounter_++;
}